

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O1

string * __thiscall
DDSInfo::PrintPixelFormatFlagNames_abi_cxx11_
          (string *__return_storage_ptr__,DDSInfo *this,uint flags)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((ulong)this & 1) != 0) {
    lVar2 = 0x143388;
    if (pixel_format_flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143388;
      lVar1 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(int *)(lVar1 + 0x20) == 0;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143388;
    if ((lVar2 != 0x143388) && (lVar1 = 0x143388, *(uint *)(lVar2 + 0x20) < 2)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 2) != 0) {
    lVar2 = 0x143388;
    if (pixel_format_flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143388;
      lVar1 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 2;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143388;
    if ((lVar2 != 0x143388) && (lVar1 = 0x143388, *(uint *)(lVar2 + 0x20) < 3)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 4) != 0) {
    lVar2 = 0x143388;
    if (pixel_format_flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143388;
      lVar1 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 4;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143388;
    if ((lVar2 != 0x143388) && (lVar1 = 0x143388, *(uint *)(lVar2 + 0x20) < 5)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x40) != 0) {
    lVar2 = 0x143388;
    if (pixel_format_flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143388;
      lVar1 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x40;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143388;
    if ((lVar2 != 0x143388) && (lVar1 = 0x143388, *(uint *)(lVar2 + 0x20) < 0x41)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  uVar3 = (uint)this;
  if ((uVar3 >> 9 & 1) != 0) {
    lVar2 = 0x143388;
    if (pixel_format_flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143388;
      lVar1 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x200;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143388;
    if ((lVar2 != 0x143388) && (lVar1 = 0x143388, *(uint *)(lVar2 + 0x20) < 0x201)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar3 >> 0x11 & 1) != 0) {
    lVar2 = 0x143388;
    if (pixel_format_flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143388;
      lVar1 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x20000;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143388;
    if ((lVar2 != 0x143388) && (lVar1 = 0x143388, *(uint *)(lVar2 + 0x20) < 0x20001)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar3 >> 0x12 & 1) != 0) {
    lVar2 = 0x143388;
    if (pixel_format_flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143388;
      lVar1 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x40000;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143388;
    if ((lVar2 != 0x143388) && (lVar1 = 0x143388, *(uint *)(lVar2 + 0x20) < 0x40001)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar3 >> 0x13 & 1) != 0) {
    lVar2 = 0x143388;
    if (pixel_format_flag_names_abi_cxx11_._16_8_ != 0) {
      lVar2 = 0x143388;
      lVar1 = pixel_format_flag_names_abi_cxx11_._16_8_;
      do {
        bVar4 = *(uint *)(lVar1 + 0x20) < 0x80000;
        if (!bVar4) {
          lVar2 = lVar1;
        }
        lVar1 = *(long *)(lVar1 + 0x10 + (ulong)bVar4 * 8);
      } while (lVar1 != 0);
    }
    lVar1 = 0x143388;
    if ((lVar2 != 0x143388) && (lVar1 = 0x143388, *(uint *)(lVar2 + 0x20) < 0x80001)) {
      lVar1 = lVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,*(long *)(lVar1 + 0x28),
               *(long *)(lVar1 + 0x30) + *(long *)(lVar1 + 0x28));
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  RemoveTrailingCharacter(__return_storage_ptr__,'|');
  return __return_storage_ptr__;
}

Assistant:

std::string PrintPixelFormatFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,pixel_format_flag_names)
    #include "defs/dds/pixel_format_flags.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }